

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O1

size_t __thiscall
polyscope::pick::localIndexToGlobal
          (pick *this,pair<polyscope::Structure_*,_unsigned_long> localPick)

{
  pick *ppVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  runtime_error *this_00;
  long *plVar4;
  bool bVar5;
  
  if (this == (pick *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    bVar5 = structureRanges == DAT_004c0a20;
    puVar3 = &structureRanges;
    if ((!bVar5) &&
       (puVar2 = (undefined8 *)
                 ((long)(((localPick.first)->objectTransform).value.value + -7) + structureRanges[2]
                 ), puVar3 = puVar2, (pick *)*structureRanges != this)) {
      plVar4 = structureRanges + 3;
      do {
        bVar5 = plVar4 == DAT_004c0a20;
        puVar3 = puVar2;
        if (bVar5) break;
        puVar3 = (undefined8 *)
                 ((long)(((localPick.first)->objectTransform).value.value + -7) + plVar4[2]);
        ppVar1 = (pick *)*plVar4;
        plVar4 = plVar4 + 3;
      } while (ppVar1 != this);
    }
    if (bVar5) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"structure does not match any allocated pick range")
      ;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (size_t)puVar3;
}

Assistant:

size_t localIndexToGlobal(std::pair<Structure*, size_t> localPick) {
  if (localPick.first == nullptr) return 0;

  for (const auto& x : structureRanges) {
    size_t rangeStart = std::get<0>(x);
    size_t rangeEnd = std::get<1>(x);
    Structure* structure = std::get<2>(x);

    if (structure == localPick.first) {
      return rangeStart + localPick.second;
    }
  }

  throw std::runtime_error("structure does not match any allocated pick range");
  return 0;
}